

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_account.c
# Opt level: O0

char * IoTHubAccount_GetEventhubConsumerGroup(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)

{
  char *__src;
  char *envVarValue;
  IOTHUB_ACCOUNT_INFO_HANDLE acctHandle_local;
  
  __src = getenv("IOTHUB_EVENTHUB_CONSUMER_GROUP");
  if (__src == (char *)0x0) {
    strcpy(IoTHubAccount_GetEventhubConsumerGroup::consumerGroup,DEFAULT_CONSUMER_GROUP);
  }
  else {
    strcpy(IoTHubAccount_GetEventhubConsumerGroup::consumerGroup,__src);
  }
  return IoTHubAccount_GetEventhubConsumerGroup::consumerGroup;
}

Assistant:

const char* IoTHubAccount_GetEventhubConsumerGroup(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)
{
    (void)acctHandle;
#ifdef MBED_BUILD_TIMESTAMP
    return getMbedParameter("IOTHUB_EVENTHUB_CONSUMER_GROUP");
#else
    static char consumerGroup[64];
    char *envVarValue = getenv("IOTHUB_EVENTHUB_CONSUMER_GROUP");
    if (envVarValue != NULL)
    {
        strcpy(consumerGroup, envVarValue);
    }
    else
    {
        strcpy(consumerGroup, DEFAULT_CONSUMER_GROUP);
    }
    return consumerGroup;
#endif
}